

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_sqadd_d_arm(void *vd,void *vq,void *vn,void *vm,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t *qc;
  uint uVar3;
  uint uVar4;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar5;
  
  uVar3 = desc * 8 & 0xff;
  uVar4 = uVar3 + 8;
  uVar5 = (ulong)uVar4;
  uVar6 = 0;
  bVar9 = false;
  do {
    uVar1 = *(ulong *)((long)vn + uVar6 * 8);
    uVar2 = *(ulong *)((long)vm + uVar6 * 8);
    uVar7 = uVar1 + uVar2;
    uVar8 = 0x8000000000000000;
    if (-1 < (long)uVar1) {
      uVar8 = 0x7fffffffffffffff;
    }
    if ((long)((uVar7 ^ uVar1) & ~(uVar2 ^ uVar1)) < 0) {
      bVar9 = true;
      uVar7 = uVar8;
    }
    *(ulong *)((long)vd + uVar6 * 8) = uVar7;
    uVar6 = uVar6 + 1;
  } while (uVar4 >> 3 != uVar6);
  if (bVar9) {
    *(undefined4 *)vq = 1;
  }
  uVar4 = desc >> 2 & 0xf8;
  if (uVar3 < uVar4) {
    uVar7 = (ulong)(uVar4 + 8);
    uVar6 = uVar5 + 8;
    if (uVar5 + 8 < uVar7) {
      uVar6 = uVar7;
    }
    memset((void *)((long)vd + uVar5),0,(~uVar5 + uVar6 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_sqadd_d)(void *vd, void *vq, void *vn,
                          void *vm, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int64_t *d = vd, *n = vn, *m = vm;
    bool q = false;

    for (i = 0; i < oprsz / 8; i++) {
        int64_t nn = n[i], mm = m[i], dd = nn + mm;
        if (((dd ^ nn) & ~(nn ^ mm)) & INT64_MIN) {
            dd = (nn >> 63) ^ ~INT64_MIN;
            q = true;
        }
        d[i] = dd;
    }
    if (q) {
        uint32_t *qc = vq;
        qc[0] = 1;
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}